

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSOSerializer.hpp
# Opt level: O0

bool Diligent::PRSSerializer<(Diligent::SerializerMode)2>::
     SerializeInternalData<Diligent::PipelineResourceSignatureInternalDataVk>
               (Serializer<(Diligent::SerializerMode)2> *Ser,
               ConstQual<Diligent::PipelineResourceSignatureInternalDataVk> *InternalData,
               DynamicLinearAllocator *Allocator)

{
  bool bVar1;
  DynamicLinearAllocator *Allocator_local;
  ConstQual<Diligent::PipelineResourceSignatureInternalDataVk> *InternalData_local;
  Serializer<(Diligent::SerializerMode)2> *Ser_local;
  
  bVar1 = Serializer<(Diligent::SerializerMode)2>::operator()
                    (Ser,(SHADER_TYPE *)InternalData,
                     &(InternalData->
                      super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
                      ).StaticResShaderStages,
                     &(InternalData->
                      super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
                      ).PipelineType,
                     &(InternalData->
                      super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
                      ).StaticResStageIndex);
  if (bVar1) {
    bVar1 = Serializer<(Diligent::SerializerMode)2>::
            SerializeArrayRaw<Diligent::PipelineResourceAttribsVk_const*const,unsigned_int_const>
                      (Ser,Allocator,
                       &(InternalData->
                        super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
                        ).pResourceAttribs,
                       &(InternalData->
                        super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
                        ).NumResources);
    if (bVar1) {
      bVar1 = Serializer<(Diligent::SerializerMode)2>::
              SerializeArrayRaw<Diligent::ImmutableSamplerAttribsVk_const*const,unsigned_int_const>
                        (Ser,Allocator,
                         &(InternalData->
                          super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
                          ).pImmutableSamplers,
                         &(InternalData->
                          super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
                          ).NumImmutableSamplers);
      if (bVar1) {
        Ser_local._7_1_ = true;
      }
      else {
        Ser_local._7_1_ = false;
      }
    }
    else {
      Ser_local._7_1_ = false;
    }
  }
  else {
    Ser_local._7_1_ = false;
  }
  return Ser_local._7_1_;
}

Assistant:

static bool SerializeInternalData(Serializer<Mode>&                                     Ser,
                                      ConstQual<PipelineResourceSignatureInternalDataType>& InternalData,
                                      DynamicLinearAllocator*                               Allocator)
    {
        if (!Ser(InternalData.ShaderStages,
                 InternalData.StaticResShaderStages,
                 InternalData.PipelineType,
                 InternalData.StaticResStageIndex))
            return false;

        if (!Ser.SerializeArrayRaw(Allocator, InternalData.pResourceAttribs, InternalData.NumResources))
            return false;

        if (!Ser.SerializeArrayRaw(Allocator, InternalData.pImmutableSamplers, InternalData.NumImmutableSamplers))
            return false;

        return true;
    }